

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.h
# Opt level: O1

bool __thiscall DyndepParser::ParseTest(DyndepParser *this,string *input,string *err)

{
  int iVar1;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"input","");
  iVar1 = (**(this->super_Parser)._vptr_Parser)(this,local_48,input,err);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool ParseTest(const std::string& input, std::string* err) {
    return Parse("input", input, err);
  }